

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

size_t serialize_string(char *buf,uint length,char *str)

{
  char cVar1;
  char *pcVar2;
  uint local_2c;
  int c;
  uint i;
  char *orig_buf;
  char *str_local;
  char *pcStack_10;
  uint length_local;
  char *buf_local;
  
  pcStack_10 = buf;
  for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
    cVar1 = str[local_2c];
    if (cVar1 == '\b') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = 'b';
    }
    else if (cVar1 == '\t') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = 't';
    }
    else if (cVar1 == '\n') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = 'n';
    }
    else if (cVar1 == '\f') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = 'f';
    }
    else if (cVar1 == '\r') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = 'r';
    }
    else if (cVar1 == '\"') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = '\"';
    }
    else if (cVar1 == '\\') {
      pcVar2 = pcStack_10 + 1;
      *pcStack_10 = '\\';
      pcStack_10 = pcStack_10 + 2;
      *pcVar2 = '\\';
    }
    else {
      *pcStack_10 = cVar1;
      pcStack_10 = pcStack_10 + 1;
    }
  }
  return (long)pcStack_10 - (long)buf;
}

Assistant:

static size_t serialize_string(char *buf,
                               unsigned int length,
                               const char *str)
{
   char *orig_buf = buf;
   unsigned int i;

   for(i = 0; i < length; ++ i)
   {
      int c = str [i];

      switch (c)
      {
      case '"':   PRINT_ESCAPED ('\"');  continue;
      case '\\':  PRINT_ESCAPED ('\\');  continue;
      case '\b':  PRINT_ESCAPED ('b');   continue;
      case '\f':  PRINT_ESCAPED ('f');   continue;
      case '\n':  PRINT_ESCAPED ('n');   continue;
      case '\r':  PRINT_ESCAPED ('r');   continue;
      case '\t':  PRINT_ESCAPED ('t');   continue;

      default:

         *buf ++ = c;
         break;
      };
   };

   return buf - orig_buf;
}